

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

bool __thiscall MT32Emu::Synth::initPCMList(Synth *this,Bit16u mapAddress,Bit16u count)

{
  byte bVar1;
  ulong uVar2;
  Bit32u BVar3;
  ControlROMPCMStruct *pCVar4;
  undefined6 in_register_00000012;
  long lVar5;
  undefined6 in_register_00000032;
  Bit32u BVar6;
  ControlROMPCMStruct **ppCVar7;
  
  pCVar4 = (ControlROMPCMStruct *)
           (this->controlROMData + (CONCAT62(in_register_00000032,mapAddress) & 0xffffffff));
  uVar2 = this->pcmROMSize;
  ppCVar7 = &this->pcmWaves->controlROMPCMStruct;
  lVar5 = 0;
  while( true ) {
    if (-lVar5 == (CONCAT62(in_register_00000012,count) & 0xffffffff)) {
      return false;
    }
    bVar1 = pCVar4->len;
    BVar6 = 0x800 << (bVar1 >> 4 & 7);
    BVar3 = (uint)pCVar4->pos * 0x800;
    if (uVar2 < BVar6 + BVar3) break;
    ((PCMWaveEntry *)(ppCVar7 + -2))->addr = BVar3;
    *(Bit32u *)((long)ppCVar7 + -0xc) = BVar6;
    *(byte *)(ppCVar7 + -1) = bVar1 >> 7;
    *ppCVar7 = pCVar4;
    lVar5 = lVar5 + -1;
    ppCVar7 = ppCVar7 + 3;
    pCVar4 = pCVar4 + 1;
  }
  printDebug(this,
             "Control ROM error: Wave map entry %d points to invalid PCM address 0x%04X, length 0x%04X"
             ,(ulong)(uint)-(int)lVar5);
  return false;
}

Assistant:

bool Synth::initPCMList(Bit16u mapAddress, Bit16u count) {
	ControlROMPCMStruct *tps = reinterpret_cast<ControlROMPCMStruct *>(&controlROMData[mapAddress]);
	for (int i = 0; i < count; i++) {
		Bit32u rAddr = tps[i].pos * 0x800;
		Bit32u rLenExp = (tps[i].len & 0x70) >> 4;
		Bit32u rLen = 0x800 << rLenExp;
		if (rAddr + rLen > pcmROMSize) {
			printDebug("Control ROM error: Wave map entry %d points to invalid PCM address 0x%04X, length 0x%04X", i, rAddr, rLen);
			return false;
		}
		pcmWaves[i].addr = rAddr;
		pcmWaves[i].len = rLen;
		pcmWaves[i].loop = (tps[i].len & 0x80) != 0;
		pcmWaves[i].controlROMPCMStruct = &tps[i];
		//int pitch = (tps[i].pitchMSB << 8) | tps[i].pitchLSB;
		//bool unaffectedByMasterTune = (tps[i].len & 0x01) == 0;
		//printDebug("PCM %d: pos=%d, len=%d, pitch=%d, loop=%s, unaffectedByMasterTune=%s", i, rAddr, rLen, pitch, pcmWaves[i].loop ? "YES" : "NO", unaffectedByMasterTune ? "YES" : "NO");
	}
	return false;
}